

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkTimeScale(Abc_Ntk_t *pNtk,float Scale)

{
  Abc_ManTime_t *pAVar1;
  void **ppvVar2;
  void **ppvVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  
  pAVar1 = pNtk->pManTime;
  if (pAVar1 != (Abc_ManTime_t *)0x0) {
    (pAVar1->tArrDef).Fall = (pAVar1->tArrDef).Fall * Scale;
    (pAVar1->tArrDef).Rise = (pAVar1->tArrDef).Rise * Scale;
    (pAVar1->tReqDef).Fall = (pAVar1->tReqDef).Fall * Scale;
    (pAVar1->tReqDef).Rise = (pAVar1->tReqDef).Rise * Scale;
    lVar5 = (long)pNtk->vCis->nSize;
    if (0 < lVar5) {
      ppvVar2 = pAVar1->vArrs->pArray;
      ppvVar3 = pNtk->vCis->pArray;
      lVar6 = 0;
      do {
        pfVar4 = (float *)ppvVar2[*(int *)((long)ppvVar3[lVar6] + 0x10)];
        pfVar4[1] = pfVar4[1] * Scale;
        *pfVar4 = *pfVar4 * Scale;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
    lVar5 = (long)pNtk->vCos->nSize;
    if (0 < lVar5) {
      ppvVar2 = pAVar1->vReqs->pArray;
      ppvVar3 = pNtk->vCos->pArray;
      lVar6 = 0;
      do {
        pfVar4 = (float *)ppvVar2[*(int *)((long)ppvVar3[lVar6] + 0x10)];
        pfVar4[1] = pfVar4[1] * Scale;
        *pfVar4 = *pfVar4 * Scale;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeScale( Abc_Ntk_t * pNtk, float Scale )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes, * pTime;
    int i;
    if ( pNtk->pManTime == NULL )
        return;
    // arrival
    pNtk->pManTime->tArrDef.Fall *= Scale;
    pNtk->pManTime->tArrDef.Rise *= Scale;
    // departure
    pNtk->pManTime->tReqDef.Fall *= Scale;
    pNtk->pManTime->tReqDef.Rise *= Scale;
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
    // set the default timing
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pTime = ppTimes[pObj->Id];
        pTime->Fall *= Scale;
        pTime->Rise *= Scale;
    }
}